

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O1

void P_DisconnectEffect(AActor *actor)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  particle_t *ppVar7;
  int *piVar8;
  int iVar9;
  DVector2 v;
  double local_40;
  double dStack_38;
  
  if (actor != (AActor *)0x0) {
    iVar9 = -0x40;
    do {
      ppVar7 = JitterParticle(0x46,1.0);
      if (ppVar7 == (particle_t *)0x0) {
        return;
      }
      uVar4 = FRandom::GenRand32(&M_Random);
      dVar1 = actor->radius;
      uVar5 = FRandom::GenRand32(&M_Random);
      dVar2 = actor->radius;
      uVar6 = FRandom::GenRand32(&M_Random);
      dVar3 = actor->Height;
      P_GetOffsetPosition((actor->__Pos).X,(actor->__Pos).Y,
                          (double)(int)((uVar4 & 0xff) - 0x80) * dVar1 * 0.0078125,
                          (double)(int)((uVar5 & 0xff) - 0x80) * dVar2 * 0.0078125);
      (ppVar7->Pos).Z = (double)(uVar6 & 0xff) * dVar3 * 0.00390625 + (actor->__Pos).Z;
      (ppVar7->Pos).X = local_40;
      (ppVar7->Pos).Y = dStack_38;
      (ppVar7->Acc).Z = (ppVar7->Acc).Z + -0.000244140625;
      uVar4 = FRandom::GenRand32(&M_Random);
      piVar8 = &maroon2;
      if (-1 < (char)uVar4) {
        piVar8 = &maroon1;
      }
      ppVar7->color = *piVar8;
      ppVar7->size = 4.0;
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
  }
  return;
}

Assistant:

void P_DisconnectEffect (AActor *actor)
{
	int i;

	if (actor == NULL)
		return;

	for (i = 64; i; i--)
	{
		particle_t *p = JitterParticle (TICRATE*2);

		if (!p)
			break;

		double xo = (M_Random() - 128)*actor->radius / 128;
		double yo = (M_Random() - 128)*actor->radius / 128;
		double zo = M_Random()*actor->Height / 256;

		DVector3 pos = actor->Vec3Offset(xo, yo, zo);
		p->Pos = pos;
		p->Acc.Z -= 1./4096;
		p->color = M_Random() < 128 ? maroon1 : maroon2;
		p->size = 4;
	}
}